

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_internal_normalise_eol(mcpl_buffer_t *bufobj)

{
  size_t sVar1;
  undefined1 *puVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  mcpl_buffer_t out;
  mcpl_buffer_t tmp;
  
  pcVar3 = bufobj->buf;
  pcVar7 = pcVar3 + bufobj->size;
  lVar5 = 0;
  while (pcVar3 != pcVar7) {
    puVar2 = (undefined1 *)memchr(pcVar3,0xd,(long)pcVar7 - (long)pcVar3);
    if (puVar2 == (undefined1 *)0x0) break;
    pcVar3 = puVar2 + 1;
    if ((pcVar3 == pcVar7) || (*pcVar3 != '\n')) {
      *puVar2 = 10;
    }
    else {
      lVar5 = lVar5 + 1;
      pcVar3 = puVar2 + 2;
    }
  }
  if (lVar5 != 0) {
    mcpl_internal_buf_create(&out,bufobj->size - lVar5);
    pcVar3 = bufobj->buf;
    pcVar6 = pcVar3 + bufobj->size;
    pcVar7 = out.buf;
    while (pcVar3 != pcVar6) {
      pvVar4 = memchr(pcVar3,0xd,(long)pcVar6 - (long)pcVar3);
      if (pvVar4 == (void *)0x0) {
        memcpy(pcVar7,pcVar3,(long)pcVar6 - (long)pcVar3);
        break;
      }
      memcpy(pcVar7,pcVar3,((long)pvVar4 - (long)pcVar3) + 1);
      if ((((char *)((long)pvVar4 + 1) == pcVar6) || (*(char *)((long)pvVar4 + 1) != '\n')) ||
         (pcVar7 = pcVar7 + ((long)pvVar4 - (long)pcVar3), *pcVar7 != '\r')) {
        mcpl_error(" mcpl_internal_normalise_eol logic error (1)");
      }
      *pcVar7 = '\n';
      pcVar7 = pcVar7 + 1;
      lVar5 = lVar5 + -1;
      pcVar3 = (char *)((long)pvVar4 + 2);
    }
    out.size = out.capacity;
    if (lVar5 != 0) {
      mcpl_error(" mcpl_internal_normalise_eol logic error (2)");
    }
    sVar1 = bufobj->capacity;
    pcVar3 = bufobj->buf;
    out.size = bufobj->size;
    bufobj->buf = out.buf;
    bufobj->size = out.capacity;
    bufobj->capacity = out.capacity;
    out.buf = pcVar3;
    out.capacity = sVar1;
    free(pcVar3);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_normalise_eol( mcpl_buffer_t* bufobj )
{
  //Replace \r\n with \n and \r with \n.

  //First replace all \r not followed by \n inplace. Noting down if we saw any
  //\r\n along the way:
  size_t count_rn = 0;
  {
    char * buf = bufobj->buf;
    char * bufE = buf + bufobj->size;
    while( buf != bufE ) {
      char * hit = (char*)memchr( buf, '\r', bufE - buf );
      if (!hit)
        break;//done
      buf = hit + 1;
      if ( buf == bufE || *buf != '\n' ) {
        *hit = '\n';// \r but not \r\n so just with \n
      } else {
        //must be \r\n
        ++count_rn;
        ++buf;//skip over the \n
      }
    }
  }

  if (!count_rn)
    return;//done, we were able to fix everything inplace

  //Next replace \r\n with \n, requiring us to copy everything except any \r
  //chars to a new buffer:
  {
    size_t count_rn_replaced = 0;
    mcpl_buffer_t out = mcpl_internal_buf_create( bufobj->size - count_rn );
    char * dest = out.buf;
    {
      const char * buf = bufobj->buf;
      const char * bufE = buf + bufobj->size;
      while ( buf != bufE ) {
        char * hit = (char*)memchr( buf, '\r', bufE-buf );
        if (!hit) {
          //no more hits, just copy the rest:
          memcpy(dest,buf,bufE-buf);
          break;
        }
        ++count_rn_replaced;
        size_t ncopym1 = hit-buf;
        size_t ncopy = ncopym1+1;
        memcpy(dest,buf,ncopy);
        dest += ncopym1;
        buf += ncopy;
        if (buf==bufE || *buf != '\n' || *dest!='\r' )
          mcpl_error(" mcpl_internal_normalise_eol logic error (1)");
        *dest = '\n';
        ++dest;
        ++buf;//skip original '\n'
      }
      out.size = out.capacity;
      if ( count_rn_replaced != count_rn )
        mcpl_error(" mcpl_internal_normalise_eol logic error (2)");
      mcpl_internal_buf_swap(&out,bufobj);
      free(out.buf);
    }
  }
}